

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

size_t utf16nbytes(void *_p,size_t n)

{
  bool bVar1;
  char *pp;
  char *p;
  size_t s;
  size_t n_local;
  void *_p_local;
  size_t local_8;
  
  if (_p == (void *)0x0) {
    local_8 = 0;
  }
  else {
    s = 0;
    pp = (char *)_p;
    while( true ) {
      bVar1 = false;
      if ((s < n >> 1) && (bVar1 = true, *pp == '\0')) {
        bVar1 = pp[1] != '\0';
      }
      if (!bVar1) break;
      pp = pp + 2;
      s = s + 1;
    }
    local_8 = s << 1;
  }
  return local_8;
}

Assistant:

static size_t
utf16nbytes(const void *_p, size_t n)
{
	size_t s;
	const char *p, *pp;

	if (_p == NULL)
		return (0);
	p = (const char *)_p;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	n >>= 1;
	while (s < n && (pp[0] || pp[1])) {
		pp += 2;
		s++;
	}
	return (s<<1);
}